

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtsp_disconnect(Curl_easy *data,connectdata *conn,_Bool dead)

{
  rtsp_conn *rtspc;
  _Bool dead_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((*(byte *)((long)&conn->proto + 0x34) >> 1 & 1) != 0) {
    Curl_dyn_free((dynbuf *)&(conn->proto).ftpc);
    *(byte *)((long)&conn->proto + 0x34) = *(byte *)((long)&conn->proto + 0x34) & 0xfd;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode rtsp_disconnect(struct Curl_easy *data,
                                struct connectdata *conn, bool dead)
{
  struct rtsp_conn *rtspc = &conn->proto.rtspc;
  (void) dead;
  (void) data;
  if(rtspc->initialised) {
    Curl_dyn_free(&conn->proto.rtspc.buf);
    rtspc->initialised = FALSE;
  }
  return CURLE_OK;
}